

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscOutboundPacketStream.cpp
# Opt level: O3

OutboundPacketStream * __thiscall
osc::OutboundPacketStream::operator<<(OutboundPacketStream *this,char *rhs)

{
  char *pcVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  
  sVar3 = strlen(rhs);
  CheckForAvailableArgumentSpace(this,(sVar3 & 0xfffffffffffffffc) + 4);
  pcVar1 = this->typeTagsCurrent_;
  this->typeTagsCurrent_ = pcVar1 + -1;
  pcVar1[-1] = 's';
  strcpy(this->argumentCurrent_,rhs);
  sVar3 = strlen(rhs);
  this->argumentCurrent_ = this->argumentCurrent_ + sVar3 + 1;
  if ((sVar3 + 1 & 3) != 0) {
    uVar4 = sVar3 + 2;
    do {
      pcVar1 = this->argumentCurrent_;
      this->argumentCurrent_ = pcVar1 + 1;
      *pcVar1 = '\0';
      uVar2 = uVar4 & 3;
      uVar4 = uVar4 + 1;
    } while (uVar2 != 0);
  }
  return this;
}

Assistant:

OutboundPacketStream& OutboundPacketStream::operator<<( const char *rhs )
{
    CheckForAvailableArgumentSpace( RoundUp4(std::strlen(rhs) + 1) );

    *(--typeTagsCurrent_) = STRING_TYPE_TAG;
    std::strcpy( argumentCurrent_, rhs );
    std::size_t rhsLength = std::strlen(rhs);
    argumentCurrent_ += rhsLength + 1;

    // zero pad to 4-byte boundary
    std::size_t i = rhsLength + 1;
    while( i & 0x3 ){
        *argumentCurrent_++ = '\0';
        ++i;
    }

    return *this;
}